

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdma.cc
# Opt level: O1

void __thiscall bsplib::Rdma::push_reg(Rdma *this,void *addr,size_t size)

{
  pointer *ppPVar1;
  size_t *psVar2;
  pointer puVar3;
  pointer pMVar4;
  iterator __position;
  void *pvVar5;
  _List_node_base *p_Var6;
  long lVar7;
  mapped_type *pmVar8;
  _List_node_base *p_Var9;
  ulong uVar10;
  long lVar11;
  ulong __n;
  _Node_alloc_type *__alloc;
  void *local_58;
  PushEntry local_50;
  
  puVar3 = (this->m_free_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_58 = addr;
  if ((this->m_free_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start == puVar3) {
    pMVar4 = (this->m_used_slots).
             super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar10 = ((long)(this->m_used_slots).
                    super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar4 >> 3) *
             -0x5555555555555555;
    p_Var6 = (_List_node_base *)(uVar10 / (ulong)(long)this->m_nprocs);
    lVar7 = (long)(this->m_used_slots).
                  super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pMVar4 >> 3;
    uVar10 = uVar10 + (long)this->m_nprocs;
    if ((ulong)(lVar7 * -0x5555555555555555) < uVar10) {
      __n = lVar7 * 0x5555555555555556;
      if (__n <= uVar10) {
        __n = uVar10;
      }
      std::vector<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>::reserve
                (&this->m_used_slots,__n);
    }
    std::vector<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>::resize
              (&this->m_used_slots,
               (long)this->m_nprocs +
               ((long)(this->m_used_slots).
                      super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_used_slots).
                      super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  }
  else {
    p_Var6 = (_List_node_base *)puVar3[-1];
    (this->m_free_slots).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3 + -1;
  }
  pvVar5 = local_58;
  lVar7 = (long)this->m_pid;
  lVar11 = (long)this->m_nprocs * (long)p_Var6;
  pMVar4 = (this->m_used_slots).
           super__Vector_base<bsplib::Rdma::Memblock,_std::allocator<bsplib::Rdma::Memblock>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar4[lVar11 + lVar7].addr = local_58;
  pMVar4[lVar11 + lVar7].size = size;
  pMVar4[lVar11 + lVar7].status = 1;
  pmVar8 = std::__detail::
           _Map_base<void_*,_std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<void_*,_std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<void_*const,_std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->m_register,&local_58);
  p_Var9 = (_List_node_base *)operator_new(0x18);
  p_Var9[1]._M_next = p_Var6;
  std::__detail::_List_node_base::_M_hook(p_Var9);
  psVar2 = &(pmVar8->super__List_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            _M_node._M_size;
  *psVar2 = *psVar2 + 1;
  local_50.block.addr = pvVar5;
  local_50.block.status = 1;
  __position._M_current =
       (this->m_send_push_pop_comm_buf).m_pushed_slots.
       super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_send_push_pop_comm_buf).m_pushed_slots.
      super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_50.block.size = size;
    local_50.slot = (Memslot)p_Var6;
    std::
    vector<bsplib::Rdma::PushPopCommBuf::PushEntry,std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>>
    ::_M_realloc_insert<bsplib::Rdma::PushPopCommBuf::PushEntry_const&>
              ((vector<bsplib::Rdma::PushPopCommBuf::PushEntry,std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>>
                *)&this->m_send_push_pop_comm_buf,__position,&local_50);
  }
  else {
    *(ulong *)&((__position._M_current)->block).status = CONCAT44(local_50.block._20_4_,1);
    (__position._M_current)->slot = (Memslot)p_Var6;
    ((__position._M_current)->block).addr = pvVar5;
    ((__position._M_current)->block).size = size;
    ppPVar1 = &(this->m_send_push_pop_comm_buf).m_pushed_slots.
               super__Vector_base<bsplib::Rdma::PushPopCommBuf::PushEntry,_std::allocator<bsplib::Rdma::PushPopCommBuf::PushEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppPVar1 = *ppPVar1 + 1;
  }
  return;
}

Assistant:

void Rdma::push_reg( void * addr, size_t size )
{
    Memslot id = no_slot();
    if ( m_free_slots.empty() ) {
        id = m_used_slots.size() / m_nprocs;

        if ( m_used_slots.capacity() < m_used_slots.size() + m_nprocs )
            m_used_slots.reserve( std::max(
                        2*m_used_slots.capacity(),
                        m_used_slots.size() + m_nprocs ) );

        m_used_slots.resize( m_used_slots.size() + m_nprocs );
    }
    else {
        id = m_free_slots.back();
        m_free_slots.pop_back();
    }

    Memblock block = { addr, size, Memblock::PUSHED };
    slot( m_pid, id ) = block;
    m_register[ addr ].push_back( id );

    PushPopCommBuf::PushEntry entry = { block, id };
    m_send_push_pop_comm_buf.m_pushed_slots.push_back( entry );
}